

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O0

void Gia_ManSortUnatesInt
               (word *pOff,word *pOn,Vec_Ptr_t *vDivs,int nWords,Vec_Int_t *vUnateLits,
               Vec_Int_t *vUnateLitsW,Vec_Wec_t *vSorter)

{
  int iVar1;
  int iVar2;
  word *x;
  Vec_Int_t *p;
  word *pDiv;
  Vec_Int_t *vLevel;
  undefined4 local_40;
  int iLit;
  int k;
  int i;
  Vec_Int_t *vUnateLitsW_local;
  Vec_Int_t *vUnateLits_local;
  int nWords_local;
  Vec_Ptr_t *vDivs_local;
  word *pOn_local;
  word *pOff_local;
  
  Vec_WecInit(vSorter,nWords << 6);
  for (iLit = 0; iVar1 = Vec_IntSize(vUnateLits), iLit < iVar1; iLit = iLit + 1) {
    iVar1 = Vec_IntEntry(vUnateLits,iLit);
    iVar2 = Abc_Lit2Var(iVar1);
    x = (word *)Vec_PtrEntry(vDivs,iVar2);
    iVar2 = Abc_LitIsCompl(iVar1);
    iVar2 = Abc_TtCountOnesVecMask(x,pOn,nWords,iVar2);
    Vec_WecPush(vSorter,iVar2,iVar1);
  }
  Vec_IntClear(vUnateLits);
  Vec_IntClear(vUnateLitsW);
  local_40 = Vec_WecSize(vSorter);
  while (local_40 = local_40 + -1, -1 < local_40) {
    p = Vec_WecEntry(vSorter,local_40);
    for (iLit = 0; iVar1 = Vec_IntSize(p), iLit < iVar1; iLit = iLit + 1) {
      iVar1 = Vec_IntEntry(p,iLit);
      Vec_IntPush(vUnateLits,iVar1);
      Vec_IntPush(vUnateLitsW,local_40);
    }
  }
  Vec_WecClear(vSorter);
  return;
}

Assistant:

void Gia_ManSortUnatesInt( word * pOff, word * pOn, Vec_Ptr_t * vDivs, int nWords, Vec_Int_t * vUnateLits, Vec_Int_t * vUnateLitsW, Vec_Wec_t * vSorter )
{
    int i, k, iLit;
    Vec_Int_t * vLevel;
    Vec_WecInit( vSorter, nWords*64 );
    Vec_IntForEachEntry( vUnateLits, iLit, i )
    {
        word * pDiv = (word *)Vec_PtrEntry(vDivs, Abc_Lit2Var(iLit));
        //assert( !Abc_TtIntersectOne( pOff, 0, pDiv, Abc_LitIsCompl(iLit), nWords ) );
        Vec_WecPush( vSorter, Abc_TtCountOnesVecMask(pDiv, pOn, nWords, Abc_LitIsCompl(iLit)), iLit );
    }
    Vec_IntClear( vUnateLits );
    Vec_IntClear( vUnateLitsW );
    Vec_WecForEachLevelReverse( vSorter, vLevel, k )
        Vec_IntForEachEntry( vLevel, iLit, i )
        {
            Vec_IntPush( vUnateLits, iLit );
            Vec_IntPush( vUnateLitsW, k );
        }
    //Vec_IntPrint( Vec_WecEntry(vSorter, 0) );
    Vec_WecClear( vSorter );
}